

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_digest.c
# Opt level: O3

void test_archive_rmd160(void)

{
  int iVar1;
  uchar buf [1];
  archive_rmd160_ctx ctx;
  uchar actualmd [21];
  uchar md [20];
  undefined1 local_71;
  archive_rmd160_ctx local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined5 uStack_58;
  undefined1 local_48 [24];
  
  local_71 = 0;
  local_68 = 0x93941bc8;
  uStack_64 = 0x1a222034;
  uStack_60 = 0xa904c07a;
  uStack_5c = 0xb1d84202;
  uStack_58 = 0xd07e5d3;
  iVar1 = __archive_ripemd160init(&local_70);
  if (iVar1 == 0) {
    iVar1 = __archive_ripemd160update(&local_70,&local_71,1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_digest.c"
                        ,L'>',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_rmd160_update(&ctx, buf, sizeof(buf))",(void *)0x0);
    iVar1 = __archive_ripemd160final(&local_70,local_48);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_digest.c"
                        ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_rmd160_final(&ctx, md)",
                        (void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_digest.c"
                        ,L'@',local_48,"md",&local_68,"actualmd",0x14,"sizeof(md)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_digest.c"
                   ,L';');
    test_skipping("This platform does not support RMD160");
  }
  return;
}

Assistant:

DEFINE_TEST(test_archive_rmd160)
{
	archive_rmd160_ctx ctx;
	unsigned char buf[] = "";
	unsigned char md[20];
	unsigned char actualmd[] = "\xc8\x1b\x94\x93\x34\x20\x22\x1a\x7a\xc0"
                             "\x04\xa9\x02\x42\xd8\xb1\xd3\xe5\x07\x0d";

	if (ARCHIVE_OK != archive_rmd160_init(&ctx)) {
		skipping("This platform does not support RMD160");
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_rmd160_update(&ctx, buf, sizeof(buf)));
	assertEqualInt(ARCHIVE_OK, archive_rmd160_final(&ctx, md));
	assertEqualMem(md, actualmd, sizeof(md));
}